

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::EquidistantDistortion::cleanProperties(EquidistantDistortion *this,Properties *prop,int id)

{
  char *pcVar1;
  undefined4 in_EDX;
  Properties *in_RSI;
  allocator local_141;
  string local_140 [32];
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  string local_38 [28];
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            ((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_59);
  gutil::Properties::remove(in_RSI,(char *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::~string(local_58);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            ((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar1,&local_b1);
  gutil::Properties::remove(in_RSI,(char *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string(local_b0);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            ((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,pcVar1,&local_f9);
  gutil::Properties::remove(in_RSI,(char *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string(local_f8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            ((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,pcVar1,&local_141);
  gutil::Properties::remove(in_RSI,(char *)local_120);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::~string(local_140);
  return;
}

Assistant:

void EquidistantDistortion::cleanProperties(gutil::Properties &prop, int id) const
{
  prop.remove(getCameraKey("e1", id).c_str());
  prop.remove(getCameraKey("e2", id).c_str());
  prop.remove(getCameraKey("e3", id).c_str());
  prop.remove(getCameraKey("e4", id).c_str());
}